

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_class_add_word(ngram_class_t *lmclass,int32 wid,int32 lweight)

{
  ngram_hash_s *pnVar1;
  uint local_28;
  uint local_24;
  int32 next;
  int32 hash;
  int32 lweight_local;
  int32 wid_local;
  ngram_class_t *lmclass_local;
  
  if (lmclass->nword_hash == (ngram_hash_s *)0x0) {
    pnVar1 = (ngram_hash_s *)
             __ckd_malloc__(0x600,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x2ce);
    lmclass->nword_hash = pnVar1;
    memset(lmclass->nword_hash,0xff,0x600);
    lmclass->n_hash = 0x80;
    lmclass->n_hash_inuse = 0;
  }
  local_24 = wid & lmclass->n_hash - 1U;
  if (lmclass->nword_hash[(int)local_24].wid == -1) {
    lmclass->nword_hash[(int)local_24].wid = wid;
    lmclass->nword_hash[(int)local_24].prob1 = lweight;
    lmclass->n_hash_inuse = lmclass->n_hash_inuse + 1;
    lmclass_local._4_4_ = local_24;
  }
  else {
    while (lmclass->nword_hash[(int)local_24].next != -1) {
      local_24 = lmclass->nword_hash[(int)local_24].next;
    }
    if (local_24 == 0xffffffff) {
      __assert_fail("hash != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                    ,0x2e4,"int32 ngram_class_add_word(ngram_class_t *, int32, int32)");
    }
    if (lmclass->n_hash_inuse == lmclass->n_hash) {
      pnVar1 = (ngram_hash_s *)
               __ckd_realloc__(lmclass->nword_hash,(long)(lmclass->n_hash << 1) * 0xc,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                               ,0x2eb);
      lmclass->nword_hash = pnVar1;
      memset(lmclass->nword_hash + lmclass->n_hash,0xff,(long)lmclass->n_hash * 0xc);
      local_28 = lmclass->n_hash;
      lmclass->n_hash = lmclass->n_hash << 1;
    }
    else {
      local_28 = 0;
      while (((int)local_28 < lmclass->n_hash && (lmclass->nword_hash[(int)local_28].wid != -1))) {
        local_28 = local_28 + 1;
      }
      if (local_28 == lmclass->n_hash) {
        __assert_fail("next != lmclass->n_hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                      ,0x2f8,"int32 ngram_class_add_word(ngram_class_t *, int32, int32)");
      }
    }
    lmclass->nword_hash[(int)local_28].wid = wid;
    lmclass->nword_hash[(int)local_28].prob1 = lweight;
    lmclass->nword_hash[(int)local_24].next = local_28;
    lmclass->n_hash_inuse = lmclass->n_hash_inuse + 1;
    lmclass_local._4_4_ = local_28;
  }
  return lmclass_local._4_4_;
}

Assistant:

int32
ngram_class_add_word(ngram_class_t * lmclass, int32 wid, int32 lweight)
{
    int32 hash;

    if (lmclass->nword_hash == NULL) {
        /* Initialize everything in it to -1 */
        lmclass->nword_hash =
            ckd_malloc(NGRAM_HASH_SIZE * sizeof(*lmclass->nword_hash));
        memset(lmclass->nword_hash, 0xff,
               NGRAM_HASH_SIZE * sizeof(*lmclass->nword_hash));
        lmclass->n_hash = NGRAM_HASH_SIZE;
        lmclass->n_hash_inuse = 0;
    }
    /* Stupidest possible hash function.  This will work pretty well
     * when this function is called repeatedly with contiguous word
     * IDs, though... */
    hash = wid & (lmclass->n_hash - 1);
    if (lmclass->nword_hash[hash].wid == -1) {
        /* Good, no collision. */
        lmclass->nword_hash[hash].wid = wid;
        lmclass->nword_hash[hash].prob1 = lweight;
        ++lmclass->n_hash_inuse;
        return hash;
    }
    else {
        int32 next; /**< Next available bucket. */
        /* Collision... Find the end of the hash chain. */
        while (lmclass->nword_hash[hash].next != -1)
            hash = lmclass->nword_hash[hash].next;
        assert(hash != -1);
        /* Does we has any more bukkit? */
        if (lmclass->n_hash_inuse == lmclass->n_hash) {
            /* Oh noes!  Ok, we makes more. */
            lmclass->nword_hash = ckd_realloc(lmclass->nword_hash,
                                              lmclass->n_hash * 2 *
                                              sizeof(*lmclass->
                                                     nword_hash));
            memset(lmclass->nword_hash + lmclass->n_hash, 0xff,
                   lmclass->n_hash * sizeof(*lmclass->nword_hash));
            /* Just use the next allocated one (easy) */
            next = lmclass->n_hash;
            lmclass->n_hash *= 2;
        }
        else {
            /* Look for any available bucket.  We hope this doesn't happen. */
            for (next = 0; next < lmclass->n_hash; ++next)
                if (lmclass->nword_hash[next].wid == -1)
                    break;
            /* This should absolutely not happen. */
            assert(next != lmclass->n_hash);
        }
        lmclass->nword_hash[next].wid = wid;
        lmclass->nword_hash[next].prob1 = lweight;
        lmclass->nword_hash[hash].next = next;
        ++lmclass->n_hash_inuse;
        return next;
    }
}